

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void btLDLTAddTL(btScalar *L,btScalar *d,btScalar *a,int n,int nskip,
                btAlignedObjectArray<float> *scratch)

{
  float *pfVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  if (n < 2) {
    return;
  }
  iVar2 = nskip * 2;
  uVar3 = scratch->m_size;
  if (SBORROW4(uVar3,iVar2) == (int)(uVar3 + nskip * -2) < 0) {
    pfVar4 = scratch->m_data;
    goto LAB_001cbff1;
  }
  lVar7 = (long)(int)uVar3;
  if (SBORROW4(scratch->m_capacity,iVar2) == scratch->m_capacity + nskip * -2 < 0) {
    pfVar4 = scratch->m_data;
  }
  else {
    if (nskip == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)iVar2 * 4,0x10);
      uVar3 = scratch->m_size;
    }
    pfVar1 = scratch->m_data;
    if ((int)uVar3 < 1) {
      if (pfVar1 != (float *)0x0) goto LAB_001cbfab;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar1[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001cbfab:
      if (scratch->m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar1);
      }
    }
    scratch->m_ownsMemory = true;
    scratch->m_data = pfVar4;
    scratch->m_capacity = iVar2;
  }
  memset(pfVar4 + lVar7,0,(iVar2 - lVar7) * 4);
LAB_001cbff1:
  scratch->m_size = iVar2;
  pfVar1 = pfVar4 + nskip;
  *pfVar4 = 0.0;
  *pfVar1 = 0.0;
  uVar5 = (ulong)(uint)n;
  uVar6 = 1;
  do {
    fVar14 = a[uVar6];
    pfVar1[uVar6] = fVar14 * 0.70710677;
    pfVar4[uVar6] = fVar14 * 0.70710677;
    uVar6 = uVar6 + 1;
  } while (uVar5 != uVar6);
  fVar16 = (*a * 0.5 + 1.0) * 0.70710677;
  fVar18 = (*a * 0.5 + -1.0) * 0.70710677;
  fVar14 = fVar16 * fVar16 * *d + 1.0;
  fVar19 = *d / fVar14;
  fVar17 = fVar16 * fVar19 * fVar18;
  pfVar8 = L + nskip;
  uVar6 = 1;
  do {
    fVar15 = pfVar4[uVar6];
    fVar20 = *pfVar8;
    pfVar4[uVar6] = -fVar16 * fVar20 + fVar15;
    pfVar1[uVar6] = fVar15 * (1.0 - fVar17) + fVar20 * (fVar17 * fVar16 - fVar18);
    uVar6 = uVar6 + 1;
    pfVar8 = pfVar8 + nskip;
  } while (uVar5 != uVar6);
  pfVar13 = L + (long)nskip + (long)(nskip + 1);
  uVar9 = 1;
  uVar6 = uVar5;
  pfVar8 = pfVar4;
  pfVar10 = pfVar1;
  fVar16 = 1.0 - fVar18 * fVar18 * fVar19;
  do {
    fVar17 = pfVar4[uVar9];
    fVar18 = pfVar1[uVar9];
    fVar19 = fVar17 * fVar17 * d[uVar9] + fVar14;
    fVar20 = d[uVar9] / fVar19;
    fVar14 = fVar14 * fVar20;
    fVar15 = fVar16 - fVar18 * fVar18 * fVar14;
    fVar14 = fVar14 / fVar15;
    d[uVar9] = fVar16 * fVar14;
    uVar9 = uVar9 + 1;
    if (uVar9 < uVar5) {
      uVar11 = 2;
      pfVar12 = pfVar13;
      do {
        fVar16 = -fVar17 * *pfVar12 + pfVar8[uVar11];
        fVar21 = fVar20 * fVar17 * fVar16 + *pfVar12;
        pfVar8[uVar11] = fVar16;
        fVar16 = -fVar18 * fVar21 + pfVar10[uVar11];
        pfVar10[uVar11] = fVar16;
        *pfVar12 = fVar14 * -fVar18 * fVar16 + fVar21;
        uVar11 = uVar11 + 1;
        pfVar12 = pfVar12 + nskip;
      } while (uVar6 != uVar11);
    }
    pfVar10 = pfVar10 + 1;
    pfVar8 = pfVar8 + 1;
    uVar6 = uVar6 - 1;
    pfVar13 = pfVar13 + (nskip + 1);
    fVar14 = fVar19;
    fVar16 = fVar15;
  } while (uVar9 != uVar5);
  return;
}

Assistant:

void btLDLTAddTL (btScalar *L, btScalar *d, const btScalar *a, int n, int nskip, btAlignedObjectArray<btScalar>& scratch)
{
  btAssert (L && d && a && n > 0 && nskip >= n);

  if (n < 2) return;
  scratch.resize(2*nskip);
  btScalar *W1 = &scratch[0];
  
  btScalar *W2 = W1 + nskip;

  W1[0] = btScalar(0.0);
  W2[0] = btScalar(0.0);
  for (int j=1; j<n; ++j) {
    W1[j] = W2[j] = (btScalar) (a[j] * SIMDSQRT12);
  }
  btScalar W11 = (btScalar) ((btScalar(0.5)*a[0]+1)*SIMDSQRT12);
  btScalar W21 = (btScalar) ((btScalar(0.5)*a[0]-1)*SIMDSQRT12);

  btScalar alpha1 = btScalar(1.0);
  btScalar alpha2 = btScalar(1.0);

  {
    btScalar dee = d[0];
    btScalar alphanew = alpha1 + (W11*W11)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = W11 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (W21*W21)*dee;
    dee /= alphanew;
    //btScalar gamma2 = W21 * dee;
    alpha2 = alphanew;
    btScalar k1 = btScalar(1.0) - W21*gamma1;
    btScalar k2 = W21*gamma1*W11 - W21;
    btScalar *ll = L + nskip;
    for (int p=1; p<n; ll+=nskip, ++p) {
      btScalar Wp = W1[p];
      btScalar ell = *ll;
      W1[p] =    Wp - W11*ell;
      W2[p] = k1*Wp +  k2*ell;
    }
  }

  btScalar *ll = L + (nskip + 1);
  for (int j=1; j<n; ll+=nskip+1, ++j) {
    btScalar k1 = W1[j];
    btScalar k2 = W2[j];

    btScalar dee = d[j];
    btScalar alphanew = alpha1 + (k1*k1)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = k1 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (k2*k2)*dee;
    dee /= alphanew;
    btScalar gamma2 = k2 * dee;
    dee *= alpha2;
    d[j] = dee;
    alpha2 = alphanew;

    btScalar *l = ll + nskip;
    for (int p=j+1; p<n; l+=nskip, ++p) {
      btScalar ell = *l;
      btScalar Wp = W1[p] - k1 * ell;
      ell += gamma1 * Wp;
      W1[p] = Wp;
      Wp = W2[p] - k2 * ell;
      ell -= gamma2 * Wp;
      W2[p] = Wp;
      *l = ell;
    }
  }
}